

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_user_domains.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3d8f9::Json2Array<aliyun::CdnDescribeUserDomainsPageDataType>::Json2Array
          (Json2Array<aliyun::CdnDescribeUserDomainsPageDataType> *this,Value *value,
          vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_e8 [8];
  CdnDescribeUserDomainsPageDataType val;
  int i;
  vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::CdnDescribeUserDomainsPageDataType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.gmt_modified.field_2._12_4_ = 0; uVar1 = val.gmt_modified.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.gmt_modified.field_2._12_4_ = val.gmt_modified.field_2._12_4_ + 1) {
      aliyun::CdnDescribeUserDomainsPageDataType::CdnDescribeUserDomainsPageDataType
                ((CdnDescribeUserDomainsPageDataType *)local_e8);
      value_00 = Json::Value::operator[](value,val.gmt_modified.field_2._12_4_);
      anon_unknown.dwarf_3d8f9::Json2Type(value_00,(CdnDescribeUserDomainsPageDataType *)local_e8);
      std::
      vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
      ::push_back(vec,(value_type *)local_e8);
      aliyun::CdnDescribeUserDomainsPageDataType::~CdnDescribeUserDomainsPageDataType
                ((CdnDescribeUserDomainsPageDataType *)local_e8);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }